

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  char *__path;
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  undefined8 extraout_RAX;
  String SStack_38;
  String local_28;
  
  do {
    iVar2 = close(*(int *)((long)child_arg + 8));
    if (iVar2 != -1) goto LAB_0013584d;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  String::Format((char *)&SStack_38,"CHECK failed: File %s, line %d: %s != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/googletest/src/gtest-death-test.cc"
                 ,0x386,"close(args->close_fd)");
  DeathTestAbort(&SStack_38);
LAB_0013584d:
  UnitTest::GetInstance();
  __path = ((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.c_str_;
  iVar2 = chdir(__path);
  if (iVar2 == 0) {
    execve(**child_arg,*child_arg,_environ);
    uVar1 = **child_arg;
    GetLastErrnoDescription();
    String::Format((char *)&SStack_38,"execve(%s, ...) in %s failed: %s",uVar1,__path,
                   local_28.c_str_);
    DeathTestAbort(&SStack_38);
  }
  GetLastErrnoDescription();
  String::Format((char *)&SStack_38,"chdir(\"%s\") failed: %s",__path,local_28.c_str_);
  DeathTestAbort(&SStack_38);
  String::~String(&SStack_38);
  String::~String(&local_28);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(String::Format("chdir(\"%s\") failed: %s",
                                  original_dir,
                                  GetLastErrnoDescription().c_str()));
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(String::Format("execve(%s, ...) in %s failed: %s",
                                args->argv[0],
                                original_dir,
                                GetLastErrnoDescription().c_str()));
  return EXIT_FAILURE;
}